

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessActive
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  Value *pVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Interpreter *this_00;
  CommissionerAppPtr commissioner;
  CommissionerAppPtr local_98;
  undefined1 local_88 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  paVar3 = &(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_dataplus._M_p = (pointer)paVar3;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_98.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_88,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_98);
  Value::Value((Value *)&stack0xffffffffffffffa0,(Error *)local_88);
  this_00 = (Interpreter *)&stack0xffffffffffffffa0;
  pVVar2 = Value::operator=(__return_storage_ptr__,(Value *)&stack0xffffffffffffffa0);
  EVar1 = (pVVar2->mError).mCode;
  Value::~Value((Value *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  if (EVar1 == kNone) {
    ProcessActiveJob((Value *)&stack0xffffffffffffffa0,this_00,&local_98,(Expression *)paVar3);
    Value::operator=(__return_storage_ptr__,(Value *)&stack0xffffffffffffffa0);
    Value::~Value((Value *)&stack0xffffffffffffffa0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessActive(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    value = ProcessActiveJob(commissioner, aExpr);
exit:
    return value;
}